

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_iterator.hpp
# Opt level: O2

merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
* __thiscall
burst::
make_merge_iterator<std::vector<boost::iterator_range<std::_List_iterator<char>>,std::allocator<boost::iterator_range<std::_List_iterator<char>>>>&,std::greater<void>>
          (merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
           *__return_storage_ptr__,burst *this)

{
  merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
  ::merge_iterator(__return_storage_ptr__,*(undefined8 *)this,*(undefined8 *)(this + 8));
  return __return_storage_ptr__;
}

Assistant:

auto make_merge_iterator (RandomAccessRange && ranges, Compare compare)
    {
        using std::begin;
        using std::end;
        return
            make_merge_iterator
            (
                begin(std::forward<RandomAccessRange>(ranges)),
                end(std::forward<RandomAccessRange>(ranges)),
                compare
            );
    }